

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O1

string * __thiscall
webfront::uri::encode_abi_cxx11_(string *__return_storage_ptr__,uri *this,string_view uri)

{
  int iVar1;
  uri __c;
  uri *puVar2;
  int iVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (uri *)0x0) {
    puVar2 = (uri *)0x0;
    do {
      __c = puVar2[uri._M_len];
      iVar3 = (int)(char)__c;
      iVar1 = isalnum(iVar3);
      if ((((iVar1 == 0) && (1 < (byte)__c - 0x2d)) && (__c != (uri)0x5f)) && (__c != (uri)0x7e)) {
        http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,"%");
        http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,encode::digits._M_elems[iVar3 >> 4]);
        __c = *(uri *)(encode::digits._M_elems + iVar3 % 0x10);
      }
      http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,(char)__c);
      puVar2 = puVar2 + 1;
    } while (this != puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string encode(std::string_view uri) {
    std::string encoded;
    static std::array digits{'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F'};
    for (auto c : uri) {
        if (std::isalnum(c) || c == '-' || c == '_' || c == '.' || c == '~')
            encoded += c;
        else {
            encoded += "%";
            encoded += digits[static_cast<size_t>(c >> 4)];
            encoded += digits[static_cast<size_t>(c % 16)];
        }
    }
    return encoded;
}